

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O3

size_t duckdb_snappy::Compress(Source *reader,Sink *writer,CompressionOptions options)

{
  uint16_t *table;
  byte bVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char *pcVar4;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong *puVar10;
  size_t sVar11;
  char ulength [5];
  size_t fragment_size;
  WorkingMemory wmem;
  int in_stack_ffffffffffffff68;
  byte local_8d;
  undefined1 local_8c [2];
  byte local_8a;
  undefined1 local_89;
  ulong local_88;
  ulong local_80;
  Sink *local_78;
  int local_6c;
  ulong local_68;
  size_t local_60;
  WorkingMemory local_58;
  undefined4 extraout_var_02;
  
  local_78 = writer;
  local_6c = options.level;
  uVar2 = (*reader->_vptr_Source[2])();
  uVar7 = CONCAT44(extraout_var,uVar2);
  local_8d = (byte)uVar2;
  if (uVar2 < 0x80) {
    puVar10 = (ulong *)local_8c;
  }
  else {
    if (uVar2 < 0x4000) {
      puVar10 = (ulong *)(local_8c + 1);
      bVar1 = (byte)(uVar2 >> 7);
    }
    else if (uVar2 < 0x200000) {
      puVar10 = (ulong *)(local_8c + 2);
      local_8c[0] = (byte)(uVar2 >> 7) | 0x80;
      bVar1 = (byte)(uVar2 >> 0xe);
    }
    else {
      local_8c[0] = (byte)(uVar2 >> 7) | 0x80;
      local_8c[1] = (byte)(uVar2 >> 0xe) | 0x80;
      bVar1 = (byte)(uVar2 >> 0x15);
      if (uVar2 < 0x10000000) {
        puVar10 = (ulong *)(local_8c + 3);
      }
      else {
        local_8a = bVar1 | 0x80;
        puVar10 = &local_88;
        bVar1 = (byte)(uVar2 >> 0x1c);
      }
    }
    local_8d = local_8d | 0x80;
    *(byte *)((long)puVar10 + -1) = bVar1;
  }
  sVar11 = (long)puVar10 - (long)&local_8d;
  (*local_78->_vptr_Sink[2])(local_78,&local_8d,sVar11);
  internal::WorkingMemory::WorkingMemory(&local_58,uVar7);
  for (; uVar7 != 0; uVar7 = uVar7 - uVar6) {
    iVar3 = (*reader->_vptr_Source[3])(reader);
    pcVar4 = local_58.input_;
    uVar9 = local_88;
    pcVar5 = (char *)CONCAT44(extraout_var_00,iVar3);
    uVar6 = 0x10000;
    if (uVar7 < 0x10000) {
      uVar6 = uVar7;
    }
    uVar8 = uVar6;
    local_60 = sVar11;
    if (local_88 < uVar6) {
      switchD_015de399::default(local_58.input_,pcVar5,local_88);
      (*reader->_vptr_Source[4])(reader,uVar9);
      do {
        iVar3 = (*reader->_vptr_Source[3])(reader,&local_88);
        uVar8 = uVar6 - uVar9;
        if (local_88 <= uVar6 - uVar9) {
          uVar8 = local_88;
        }
        switchD_015de399::default(pcVar4 + uVar9,(void *)CONCAT44(extraout_var_01,iVar3),uVar8);
        (*reader->_vptr_Source[4])(reader);
        uVar9 = uVar9 + uVar8;
      } while (uVar9 < uVar6);
      local_68 = 0;
      pcVar5 = pcVar4;
      uVar8 = local_68;
    }
    local_68 = uVar8;
    uVar2 = 0x8000;
    if ((uVar7 < 0x8001) && (uVar2 = 0x100, 0xff < uVar7)) {
      uVar2 = (int)uVar6 - 1;
      iVar3 = 0x1f;
      if (uVar2 != 0) {
        for (; uVar2 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      uVar2 = 2 << ((byte)iVar3 & 0x1f);
    }
    local_88 = uVar6;
    local_80 = uVar7;
    switchD_01043a80::default(local_58.table_,0,(ulong)(uVar2 * 2));
    table = local_58.table_;
    iVar3 = (*local_78->_vptr_Sink[3])(local_78,uVar6 + uVar6 / 6 + 0x20,local_58.output_);
    pcVar4 = (char *)CONCAT44(extraout_var_02,iVar3);
    if (local_6c == 1) {
      pcVar5 = internal::CompressFragment(pcVar5,local_88,pcVar4,table,uVar2);
    }
    else if (local_6c == 2) {
      pcVar5 = internal::CompressFragmentDoubleHash
                         (pcVar5,local_88,pcVar4,table,uVar2 >> 1,
                          (uint16_t *)((ulong)uVar2 + (long)table),in_stack_ffffffffffffff68);
    }
    else {
      pcVar5 = (char *)0x0;
    }
    uVar7 = local_80;
    (*local_78->_vptr_Sink[2])(local_78,pcVar4,(long)pcVar5 - (long)pcVar4);
    (*reader->_vptr_Source[4])(reader,local_68);
    sVar11 = local_60 + ((long)pcVar5 - (long)pcVar4);
  }
  internal::WorkingMemory::~WorkingMemory(&local_58);
  return sVar11;
}

Assistant:

size_t Compress(Source* reader, Sink* writer, CompressionOptions options) {
  assert(options.level == 1 || options.level == 2);
  int token = 0;
  size_t written = 0;
  size_t N = reader->Available();
  const size_t uncompressed_size = N;
  char ulength[Varint::kMax32];
  char* p = Varint::Encode32(ulength, N);
  writer->Append(ulength, p - ulength);
  written += (p - ulength);

  internal::WorkingMemory wmem(N);

  while (N > 0) {
    // Get next block to compress (without copying if possible)
    size_t fragment_size;
    const char* fragment = reader->Peek(&fragment_size);
    assert(fragment_size != 0);  // premature end of input
    const size_t num_to_read = std::min(N, kBlockSize);
    size_t bytes_read = fragment_size;

    size_t pending_advance = 0;
    if (bytes_read >= num_to_read) {
      // Buffer returned by reader is large enough
      pending_advance = num_to_read;
      fragment_size = num_to_read;
    } else {
      char* scratch = wmem.GetScratchInput();
      std::memcpy(scratch, fragment, bytes_read);
      reader->Skip(bytes_read);

      while (bytes_read < num_to_read) {
        fragment = reader->Peek(&fragment_size);
        size_t n = std::min<size_t>(fragment_size, num_to_read - bytes_read);
        std::memcpy(scratch + bytes_read, fragment, n);
        bytes_read += n;
        reader->Skip(n);
      }
      assert(bytes_read == num_to_read);
      fragment = scratch;
      fragment_size = num_to_read;
    }
    assert(fragment_size == num_to_read);

    // Get encoding table for compression
    int table_size;
    uint16_t* table = wmem.GetHashTable(num_to_read, &table_size);

    // Compress input_fragment and append to dest
    int max_output = MaxCompressedLength(num_to_read);

    // Since we encode kBlockSize regions followed by a region
    // which is <= kBlockSize in length, a previously allocated
    // scratch_output[] region is big enough for this iteration.
    // Need a scratch buffer for the output, in case the byte sink doesn't
    // have room for us directly.
    char* dest = writer->GetAppendBuffer(max_output, wmem.GetScratchOutput());
    char* end = nullptr;
    if (options.level == 1) {
      end = internal::CompressFragment(fragment, fragment_size, dest, table,
                                       table_size);
    } else if (options.level == 2) {
      end = internal::CompressFragmentDoubleHash(
          fragment, fragment_size, dest, table, table_size >> 1,
          table + (table_size >> 1), table_size >> 1);
    }
    writer->Append(dest, end - dest);
    written += (end - dest);

    N -= num_to_read;
    reader->Skip(pending_advance);
  }

  Report(token, "snappy_compress", written, uncompressed_size);
  return written;
}